

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_math.cpp
# Opt level: O1

void fm_eulerMatrix(float ax,float ay,float az,float *matrix)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  float quat [4];
  float local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  fVar2 = cosf(ax * 0.5);
  fVar3 = cosf(ay * 0.5);
  fVar4 = cosf(az * 0.5);
  fVar5 = sinf(ax * 0.5);
  fVar6 = sinf(ay * 0.5);
  fVar7 = sinf(az * 0.5);
  auVar1 = vfmsub231ss_fma(ZEXT416((uint)(fVar6 * fVar7 * fVar2)),ZEXT416((uint)fVar5),
                           ZEXT416((uint)(fVar3 * fVar4)));
  local_18 = auVar1._0_4_;
  auVar8 = ZEXT416((uint)fVar2);
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar3 * fVar7)),auVar8,
                           ZEXT416((uint)(fVar4 * fVar6)));
  local_14 = auVar1._0_4_;
  auVar1 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * fVar6 * fVar5)),auVar8,
                           ZEXT416((uint)(fVar3 * fVar7)));
  local_10 = auVar1._0_4_;
  auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar6 * fVar7)),auVar8,
                           ZEXT416((uint)(fVar3 * fVar4)));
  local_c = auVar1._0_4_;
  fm_quatToMatrix(&local_18,matrix);
  return;
}

Assistant:

void fm_eulerMatrix(float ax,float ay,float az,float *matrix) // convert euler (in radians) to a dest 4x4 matrix (translation set to zero)
{
  float quat[4];
  fm_eulerToQuat(ax,ay,az,quat);
  fm_quatToMatrix(quat,matrix);
}